

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathStringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr ctxt_00;
  xmlChar *val;
  xmlXPathObjectPtr pxVar1;
  xmlXPathObjectPtr cur;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 0) {
      ctxt_00 = ctxt->context;
      val = xmlXPathCastNodeToString(ctxt->context->node);
      pxVar1 = xmlXPathCacheWrapString(ctxt_00,val);
      valuePush(ctxt,pxVar1);
    }
    else if (ctxt != (xmlXPathParserContextPtr)0x0) {
      if (nargs == 1) {
        if (ctxt->valueNr < ctxt->valueFrame + 1) {
          xmlXPathErr(ctxt,0x17);
        }
        else {
          pxVar1 = valuePop(ctxt);
          if (pxVar1 == (xmlXPathObjectPtr)0x0) {
            xmlXPathErr(ctxt,10);
          }
          else {
            pxVar1 = xmlXPathCacheConvertString(ctxt->context,pxVar1);
            valuePush(ctxt,pxVar1);
          }
        }
      }
      else {
        xmlXPathErr(ctxt,0xc);
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathStringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;
    if (nargs == 0) {
    valuePush(ctxt,
	xmlXPathCacheWrapString(ctxt->context,
	    xmlXPathCastNodeToString(ctxt->context->node)));
	return;
    }

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    valuePush(ctxt, xmlXPathCacheConvertString(ctxt->context, cur));
}